

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O3

void xSAT_SolverDestroy(xSAT_Solver_t *s)

{
  xSAT_Mem_t *__ptr;
  uint *puVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  xSAT_VecWatchList_t *pxVar4;
  xSAT_WatchList_t *pxVar5;
  void *pvVar6;
  xSAT_Heap_t *__ptr_00;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  xSAT_BQueue_t *pxVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  __ptr = s->pMemory;
  puVar1 = __ptr->pData;
  if (puVar1 != (uint *)0x0) {
    free(puVar1);
  }
  free(__ptr);
  pVVar2 = s->vClauses;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = s->vLearnts;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pxVar4 = s->vWatches;
  iVar10 = pxVar4->nSize;
  if (0 < iVar10) {
    lVar12 = 8;
    lVar11 = 0;
    do {
      pxVar5 = pxVar4->pArray;
      pvVar6 = *(void **)((long)&pxVar5->nCap + lVar12);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
        *(undefined8 *)((long)&pxVar5->nCap + lVar12) = 0;
        iVar10 = pxVar4->nSize;
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar11 < iVar10);
  }
  if (pxVar4->pArray != (xSAT_WatchList_t *)0x0) {
    free(pxVar4->pArray);
  }
  free(pxVar4);
  pxVar4 = s->vBinWatches;
  iVar10 = pxVar4->nSize;
  if (0 < iVar10) {
    lVar12 = 8;
    lVar11 = 0;
    do {
      pxVar5 = pxVar4->pArray;
      pvVar6 = *(void **)((long)&pxVar5->nCap + lVar12);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
        *(undefined8 *)((long)&pxVar5->nCap + lVar12) = 0;
        iVar10 = pxVar4->nSize;
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar11 < iVar10);
  }
  if (pxVar4->pArray != (xSAT_WatchList_t *)0x0) {
    free(pxVar4->pArray);
  }
  free(pxVar4);
  __ptr_00 = s->hOrder;
  pVVar2 = __ptr_00->vIndices;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = __ptr_00->vHeap;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  free(__ptr_00);
  pVVar2 = s->vTrailLim;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = s->vTrail;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = s->vTagged;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = s->vStack;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar7 = s->vSeen;
  pcVar8 = pVVar7->pArray;
  if (pcVar8 != (char *)0x0) {
    free(pcVar8);
  }
  free(pVVar7);
  pVVar2 = s->vLearntClause;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = s->vLastDLevel;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = s->vActivity;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar7 = s->vPolarity;
  pcVar8 = pVVar7->pArray;
  if (pcVar8 != (char *)0x0) {
    free(pcVar8);
  }
  free(pVVar7);
  pVVar7 = s->vTags;
  pcVar8 = pVVar7->pArray;
  if (pcVar8 != (char *)0x0) {
    free(pcVar8);
  }
  free(pVVar7);
  pVVar7 = s->vAssigns;
  pcVar8 = pVVar7->pArray;
  if (pcVar8 != (char *)0x0) {
    free(pcVar8);
  }
  free(pVVar7);
  pVVar2 = s->vLevels;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = s->vReasons;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = s->vStamp;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pxVar9 = s->bqLBD;
  puVar1 = pxVar9->pData;
  if (puVar1 != (uint *)0x0) {
    free(puVar1);
  }
  free(pxVar9);
  pxVar9 = s->bqTrail;
  puVar1 = pxVar9->pData;
  if (puVar1 != (uint *)0x0) {
    free(puVar1);
  }
  free(pxVar9);
  free(s);
  return;
}

Assistant:

void xSAT_SolverDestroy( xSAT_Solver_t * s )
{
    xSAT_MemFree( s->pMemory );
    Vec_IntFree( s->vClauses );
    Vec_IntFree( s->vLearnts );
    xSAT_VecWatchListFree( s->vWatches );
    xSAT_VecWatchListFree( s->vBinWatches );

    xSAT_HeapFree(s->hOrder);
    Vec_IntFree( s->vTrailLim );
    Vec_IntFree( s->vTrail );
    Vec_IntFree( s->vTagged );
    Vec_IntFree( s->vStack );

    Vec_StrFree( s->vSeen );
    Vec_IntFree( s->vLearntClause );
    Vec_IntFree( s->vLastDLevel );

    Vec_IntFree( s->vActivity );
    Vec_StrFree( s->vPolarity );
    Vec_StrFree( s->vTags );
    Vec_StrFree( s->vAssigns );
    Vec_IntFree( s->vLevels );
    Vec_IntFree( s->vReasons );
    Vec_IntFree( s->vStamp );

    xSAT_BQueueFree(s->bqLBD);
    xSAT_BQueueFree(s->bqTrail);

    ABC_FREE(s);
}